

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O2

void * __thiscall ncnn::UnlockedPoolAllocator::fastMalloc(UnlockedPoolAllocator *this,size_t size)

{
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *this_00;
  _List_node_base *p_Var1;
  UnlockedPoolAllocatorPrivate *pUVar2;
  _List_node_base *p_Var3;
  const_iterator __position;
  value_type local_30;
  
  this_00 = &this->d->budgets;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      p_Var3 = (_List_node_base *)ncnn::fastMalloc(size);
      pUVar2 = this->d;
      local_30.first = size;
      goto LAB_002d54ee;
    }
    p_Var1 = __position._M_node[1]._M_next;
  } while ((p_Var1 < size) || (size < (ulong)this->d->size_compare_ratio * (long)p_Var1 >> 8));
  p_Var3 = __position._M_node[1]._M_prev;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::erase
            (this_00,__position);
  pUVar2 = this->d;
  local_30.first = (unsigned_long)p_Var1;
LAB_002d54ee:
  local_30.second = p_Var3;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back(&pUVar2->payouts,&local_30);
  return p_Var3;
}

Assistant:

void* UnlockedPoolAllocator::fastMalloc(size_t size)
{
    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->payouts.push_back(std::make_pair(bs, ptr));

            return ptr;
        }
    }

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts.push_back(std::make_pair(size, ptr));

    return ptr;
}